

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.hpp
# Opt level: O2

string * __thiscall KV::KeyValues::getKey_abi_cxx11_(string *__return_storage_ptr__,KeyValues *this)

{
  if (this->key == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->key);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getKey() const { return ( key ) ? *key : std::string(); }